

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

shared_ptr<Map_Item> __thiscall
Map::AddItem(Map *this,short id,int amount,uchar x,uchar y,Character *from)

{
  World *pWVar1;
  Character *this_00;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _List_node_base *p_Var6;
  int iVar7;
  Map *this_01;
  undefined6 in_register_00000032;
  int iVar8;
  shared_ptr<Map_Item> sVar9;
  Character *in_stack_00000008;
  uchar y_local;
  uchar x_local;
  short id_local;
  allocator<char> local_99;
  Map *local_98;
  Map *local_90;
  undefined4 local_88;
  int amount_local;
  PacketBuilder builder;
  key_type local_50;
  
  this_01 = (Map *)CONCAT62(in_register_00000032,id);
  id_local = (short)amount;
  amount_local = (int)CONCAT71(in_register_00000009,x);
  y_local = (uchar)from;
  builder.id = 0;
  builder._2_2_ = 0;
  local_50._M_dataplus._M_p._0_4_ = 0;
  local_88 = 0;
  x_local = y;
  std::make_shared<Map_Item,int,short&,int&,unsigned_char&,unsigned_char&,int,int>
            ((int *)this,(short *)&builder,(int *)&id_local,(uchar *)&amount_local,&x_local,
             (int *)&y_local,(int *)&local_50);
  if (in_stack_00000008 != (Character *)0x0) {
    iVar7 = 0;
    iVar8 = 0;
    p_Var6 = (_List_node_base *)&this_01->items;
    local_98 = this;
    local_90 = this_01;
    while (p_Var6 = (((_List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)&this_01->items) {
      std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)&builder,
                 (__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 1));
      if (*(uchar *)(CONCAT44(builder._4_4_,builder._0_4_) + 8) == x_local) {
        iVar7 = iVar7 + (uint)(*(uchar *)(CONCAT44(builder._4_4_,builder._0_4_) + 9) == y_local);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&builder.data);
      iVar8 = iVar8 + 1;
    }
    pWVar1 = local_90->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"MaxTile",(allocator<char> *)&local_88);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,(key_type *)&builder);
    iVar3 = util::variant::GetInt(pmVar4);
    if (iVar3 <= iVar7) {
      std::__cxx11::string::~string((string *)&builder);
      _Var5._M_pi = extraout_RDX_01;
      goto LAB_0015d5e4;
    }
    pWVar1 = local_90->world;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"MaxMap",&local_99);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,&local_50);
    iVar7 = util::variant::GetInt(pmVar4);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&builder);
    _Var5._M_pi = extraout_RDX;
    this_01 = local_90;
    this = local_98;
    if (iVar7 <= iVar8) goto LAB_0015d5e4;
  }
  iVar7 = GenerateItemID(this_01);
  *(short *)&this->world->last_character_id = (short)iVar7;
  PacketBuilder::PacketBuilder(&builder,PACKET_ITEM,PACKET_ADD,9);
  PacketBuilder::AddShort(&builder,(int)id_local);
  PacketBuilder::AddShort(&builder,(int)(short)this->world->last_character_id);
  PacketBuilder::AddThree(&builder,amount_local);
  PacketBuilder::AddChar(&builder,(uint)x_local);
  PacketBuilder::AddChar(&builder,(uint)y_local);
  p_Var6 = (_List_node_base *)&this_01->characters;
  while (p_Var6 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var6->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&this_01->characters) {
    this_00 = (Character *)p_Var6[1]._M_next;
    if ((in_stack_00000008 == (Character *)0x0) || (this_00 != in_stack_00000008)) {
      bVar2 = Character::InRange(this_00,(Map_Item *)this->world);
      if (bVar2) {
        Character::Send(this_00,&builder);
      }
    }
  }
  std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
  push_back(&this_01->items,(value_type *)this);
  PacketBuilder::~PacketBuilder(&builder);
  _Var5._M_pi = extraout_RDX_00;
  local_98 = this;
LAB_0015d5e4:
  sVar9.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar9.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_98;
  return (shared_ptr<Map_Item>)sVar9.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Map_Item> Map::AddItem(short id, int amount, unsigned char x, unsigned char y, Character *from)
{
	std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(0, id, amount, x, y, 0, 0));

	if (from || (from && from->SourceAccess() <= ADMIN_GM))
	{
		int ontile = 0;
		int onmap = 0;

		UTIL_FOREACH(this->items, item)
		{
			++onmap;
			if (item->x == x && item->y == y)
			{
				++ontile;
			}
		}

		if (ontile >= static_cast<int>(this->world->config["MaxTile"]) || onmap >= static_cast<int>(this->world->config["MaxMap"]))
		{
			return newitem;
		}
	}

	newitem->uid = GenerateItemID();

	PacketBuilder builder(PACKET_ITEM, PACKET_ADD, 9);
	builder.AddShort(id);
	builder.AddShort(newitem->uid);
	builder.AddThree(amount);
	builder.AddChar(x);
	builder.AddChar(y);

	UTIL_FOREACH(this->characters, character)
	{
		if ((from && character == from) || !character->InRange(*newitem))
		{
			continue;
		}

		character->Send(builder);
	}

	this->items.push_back(newitem);
	return newitem;
}